

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup_p.h
# Opt level: O3

void __thiscall QDnsLookupPrivate::nameserverChanged(QDnsLookupPrivate *this)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  void *local_28;
  QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
  *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  if ((*(long **)&this->field_0x48 != (long *)0x0) && (**(long **)&this->field_0x48 != 0)) {
    QBindingStorage::registerDependency_helper((QUntypedPropertyData *)&this->field_0x40);
  }
  local_28 = (void *)0x0;
  local_20 = &this->nameserver;
  QMetaObject::activate(pQVar1,&QDnsLookup::staticMetaObject,3,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void nameserverChanged()
    {
        emit q_func()->nameserverChanged(nameserver);
    }